

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O0

int Molecular_Dynamics(double (*x) [3],double (*A) [3],double *ham_init,double *ham_fin)

{
  double dVar1;
  int local_94;
  int local_90;
  int idim_5;
  int idim_4;
  int idim_3;
  int idim_2;
  int step;
  int idim_1;
  int idim;
  double r2;
  double r1;
  double delh [3];
  double local_48;
  double p [3];
  double *ham_fin_local;
  double *ham_init_local;
  double (*A_local) [3];
  double (*x_local) [3];
  
  for (step = 0; step < 3; step = step + 1) {
    BoxMuller(&r2,(double *)&idim_1);
    p[(long)step + -1] = r2;
  }
  dVar1 = calc_hamiltonian(*x,&local_48,A);
  *ham_init = dVar1;
  for (idim_2 = 0; idim_2 < 3; idim_2 = idim_2 + 1) {
    (*x)[idim_2] = p[(long)idim_2 + -1] * 0.5 + (*x)[idim_2];
  }
  for (idim_3 = 1; idim_3 < 0x28; idim_3 = idim_3 + 1) {
    calc_delh(*x,A,(double (*) [3])&r1);
    for (idim_4 = 0; idim_4 < 3; idim_4 = idim_4 + 1) {
      p[(long)idim_4 + -1] = -delh[(long)idim_4 + -1] + p[(long)idim_4 + -1];
    }
    for (idim_5 = 0; idim_5 < 3; idim_5 = idim_5 + 1) {
      (*x)[idim_5] = p[(long)idim_5 + -1] + (*x)[idim_5];
    }
  }
  calc_delh(*x,A,(double (*) [3])&r1);
  for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
    p[(long)local_90 + -1] = -delh[(long)local_90 + -1] + p[(long)local_90 + -1];
  }
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    (*x)[local_94] = p[(long)local_94 + -1] * 0.5 + (*x)[local_94];
  }
  dVar1 = calc_hamiltonian(*x,&local_48,A);
  *ham_fin = dVar1;
  return 0;
}

Assistant:

int Molecular_Dynamics(double (&x)[ndim], const double A[ndim][ndim], double &ham_init,
                       double &ham_fin) {
    double p[ndim];
    double delh[ndim];
    double r1, r2;
    for (int idim = 0; idim < ndim; idim++) {
        BoxMuller(r1, r2);
        p[idim] = r1;
    }
    ham_init = calc_hamiltonian(x, p, A);

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    for (int step = 1; step < ntau; step++) {
        calc_delh(x, A, delh);
        for (int idim = 0; idim < ndim; idim++) {
            p[idim] -= delh[idim] * dtau;
        }
        for (int idim = 0; idim < ndim; idim++) {
            x[idim] += p[idim] * dtau;
        }
    }
    calc_delh(x, A, delh);
    for (int idim = 0; idim < ndim; idim++) {
        p[idim] -= delh[idim] * dtau;
    }
    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    ham_fin = calc_hamiltonian(x, p, A);
    return 0;
}